

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void llb_set_quality_of_service(llb_quality_of_service_t level)

{
  QualityOfService *pQVar1;
  Optional<llbuild::basic::QualityOfService> qos;
  OptionalStorage<llbuild::basic::QualityOfService,_true> local_8;
  
  if (level != llb_quality_of_service_unspecified) {
    local_8 = (OptionalStorage<llbuild::basic::QualityOfService,_true>)getQoSFromLLBQoS(level);
    if (((ulong)local_8 >> 0x20 & 1) != 0) {
      pQVar1 = llvm::Optional<llbuild::basic::QualityOfService>::getPointer
                         ((Optional<llbuild::basic::QualityOfService> *)&local_8);
      llbuild::basic::setDefaultQualityOfService(*pQVar1);
    }
    return;
  }
  __assert_fail("level != llb_quality_of_service_unspecified",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                ,0x5d5,"void llb_set_quality_of_service(llb_quality_of_service_t)");
}

Assistant:

void llb_set_quality_of_service(llb_quality_of_service_t level) {
  assert(level != llb_quality_of_service_unspecified);
  Optional<QualityOfService> qos = getQoSFromLLBQoS(level);
  if (qos.hasValue())
    setDefaultQualityOfService(qos.getValue());
}